

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O1

RK_S32 av1d_split_frame(Av1CodecContext *ctx,RK_U8 **out_data,RK_S32 *out_size,RK_U8 *data,
                       RK_S32 size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  RK_S32 RVar4;
  RK_U8 *buf;
  long lVar5;
  AV1OBU obu;
  AV1OBU local_b8;
  
  lVar5 = (long)size;
  if (((byte)av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_split_frame",ctx);
  }
  *out_data = data;
  buf = data;
  do {
    if (data + lVar5 <= buf) goto LAB_001bed59;
    uVar2 = av1_extract_obu(&local_b8,buf,size);
    if ((int)uVar2 < 0) {
      iVar3 = 5;
    }
    else {
      if ((uint)local_b8.type < 7) {
        if ((0x26U >> (local_b8.type & 0x1fU) & 1) == 0) {
          uVar1 = 0x48U >> (local_b8.type & 0x1fU) & 1;
        }
        else {
          uVar1 = ctx->frame_header;
        }
        if (uVar1 != 0) {
          ctx->frame_header = ctx->frame_header + 1;
        }
      }
      if (ctx->frame_header != 2) {
        buf = buf + uVar2;
        size = size - uVar2;
        iVar3 = 0;
        if (local_b8.type != 6) goto LAB_001bed4c;
      }
      uVar2 = (int)buf - (int)data;
      out_data = (RK_U8 **)(ulong)uVar2;
      *out_size = uVar2;
      ctx->frame_header = 0;
      ctx->new_frame = 1;
      iVar3 = 1;
    }
LAB_001bed4c:
    RVar4 = (RK_S32)out_data;
  } while (iVar3 == 0);
  if (iVar3 == 5) {
LAB_001bed59:
    RVar4 = (int)buf - (int)data;
    *out_size = RVar4;
  }
  return RVar4;
}

Assistant:

RK_S32 av1d_split_frame(Av1CodecContext *ctx,
                        RK_U8 **out_data, RK_S32 *out_size,
                        RK_U8 *data, RK_S32 size)
{
    (void)out_data;
    (void)out_size;

    AV1OBU obu;
    uint8_t *ptr = data, *end = data + size;
    av1d_dbg_func("enter ctx %p\n", ctx);

    *out_data = data;

    while (ptr < end) {
        RK_S32 len = av1_extract_obu(&obu, ptr, size);
        if (len < 0)
            break;
        if (obu.type == AV1_OBU_FRAME_HEADER || obu.type == AV1_OBU_FRAME ||
            ((obu.type == AV1_OBU_TEMPORAL_DELIMITER || obu.type == AV1_OBU_METADATA ||
              obu.type == AV1_OBU_SEQUENCE_HEADER) && ctx->frame_header))
            ctx->frame_header ++;
        if (ctx->frame_header == 2) {
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        if (obu.type == AV1_OBU_FRAME) {
            ptr      += len;
            size     -= len;
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        ptr      += len;
        size -= len;
    }

    *out_size = (RK_S32)(ptr - data);

    return ptr - data;

    av1d_dbg_func("leave ctx %p\n", ctx);

    return 0;
}